

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

void dgrminer::fail_with_message(string *message,int line_number)

{
  undefined8 extraout_RAX;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_68,message," (LINE ");
  std::__cxx11::to_string(&sStack_88,line_number);
  std::operator+(&local_48,&local_68,&sStack_88);
  std::operator+(&local_28,&local_48,")");
  fail_with_message(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void fail_with_message(std::string message, int line_number)
    {
        fail_with_message(message + " (LINE " + std::to_string(line_number) + ")");
    }